

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O1

uint32_t MurmurHashAligned2(void *key,int len,uint32_t seed)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  uVar5 = seed ^ len;
  uVar11 = (uint)key & 3;
  if (len < 4 || ((ulong)key & 3) == 0) {
    iVar8 = len;
    if (3 < len) {
      do {
        uVar5 = uVar5 * 0x5bd1e995 ^
                ((uint)(*key * 0x5bd1e995) >> 0x18 ^ *key * 0x5bd1e995) * 0x5bd1e995;
        key = (void *)((long)key + 4);
        len = iVar8 + -4;
        bVar2 = 7 < iVar8;
        iVar8 = len;
      } while (bVar2);
    }
    if (len != 1) {
      if (len != 2) {
        if (len != 3) goto LAB_00166c3f;
        uVar5 = uVar5 ^ (uint)*(byte *)((long)key + 2) << 0x10;
      }
      uVar5 = uVar5 ^ (uint)*(byte *)((long)key + 1) << 8;
    }
    bVar1 = *key;
  }
  else {
    uVar3 = 0;
    uVar10 = 0;
    if (uVar11 != 3) {
      if (uVar11 != 2) {
        uVar10 = (uint)*(byte *)((long)key + 2) << 0x10;
      }
      uVar3 = uVar10 | (uint)*(byte *)((long)key + 1) << 8;
    }
    iVar8 = uVar11 * 8;
    uVar10 = (*key | uVar3) << iVar8;
    uVar3 = 4 - uVar11;
    puVar4 = (uint *)((ulong)uVar3 + (long)key);
    uVar12 = len - uVar3;
    uVar3 = uVar3 * 8;
    if (3 < (int)uVar12) {
      iVar7 = len + uVar11;
      do {
        iVar6 = iVar7;
        uVar12 = uVar10 >> iVar8;
        uVar10 = *puVar4;
        uVar12 = (uVar10 << (uVar3 & 0x1f) | uVar12) * 0x5bd1e995;
        uVar5 = uVar5 * 0x5bd1e995 ^ (uVar12 >> 0x18 ^ uVar12) * 0x5bd1e995;
        puVar4 = puVar4 + 1;
        iVar7 = iVar6 + -4;
      } while (7 < iVar7);
      uVar12 = iVar6 - 8;
    }
    if ((int)uVar12 < (int)uVar11) {
      if (uVar12 != 0) {
        uVar11 = 0;
        if (uVar12 != 1) {
          uVar11 = (uint)*(byte *)((long)puVar4 + 1) << 8;
        }
        uVar12 = (byte)*puVar4 | uVar11;
      }
      uVar5 = ((uVar12 << (uVar3 & 0x1f) | uVar10 >> iVar8) ^ uVar5) * 0x5bd1e995;
      goto LAB_00166c3f;
    }
    uVar13 = 0;
    if (uVar11 != 1) {
      if (uVar11 != 2) {
        uVar13 = (uint)*(byte *)((long)puVar4 + 2) << 0x10;
      }
      uVar13 = uVar13 | (uint)*(byte *)((long)puVar4 + 1) << 8;
    }
    uVar10 = (((byte)*puVar4 | uVar13) << (uVar3 & 0x1f) | uVar10 >> iVar8) * 0x5bd1e995;
    uVar5 = uVar5 * 0x5bd1e995 ^ (uVar10 >> 0x18 ^ uVar10) * 0x5bd1e995;
    uVar9 = (ulong)((uint)key & 3);
    if (uVar12 - uVar11 != 1) {
      if (uVar12 - uVar11 != 2) goto LAB_00166c3f;
      uVar5 = uVar5 ^ (uint)*(byte *)((long)puVar4 + uVar9 + 1) << 8;
    }
    bVar1 = *(byte *)((long)puVar4 + uVar9);
  }
  uVar5 = (bVar1 ^ uVar5) * 0x5bd1e995;
LAB_00166c3f:
  uVar5 = (uVar5 >> 0xd ^ uVar5) * 0x5bd1e995;
  return uVar5 >> 0xf ^ uVar5;
}

Assistant:

uint32_t MurmurHashAligned2 ( const void * key, int len, uint32_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  const unsigned char * data = (const unsigned char *)key;

  uint32_t h = seed ^ len;

  int align = (uint64_t)data & 3;

  if(align && (len >= 4))
  {
    // Pre-load the temp registers

    uint32_t t = 0, d = 0;

    switch(align)
    {
      case 1: t |= data[2] << 16;
      case 2: t |= data[1] << 8;
      case 3: t |= data[0];
    }

    t <<= (8 * align);

    data += 4-align;
    len -= 4-align;

    int sl = 8 * (4-align);
    int sr = 8 * align;

    // Mix

    while(len >= 4)
    {
      d = *(uint32_t *)data;
      t = (t >> sr) | (d << sl);

      uint32_t k = t;

      MIX(h,k,m);

      t = d;

      data += 4;
      len -= 4;
    }

    // Handle leftover data in temp registers

    d = 0;

    if(len >= align)
    {
      switch(align)
      {
      case 3: d |= data[2] << 16;
      case 2: d |= data[1] << 8;
      case 1: d |= data[0];
      }

      uint32_t k = (t >> sr) | (d << sl);
      MIX(h,k,m);

      data += align;
      len -= align;

      //----------
      // Handle tail bytes

      switch(len)
      {
      case 3: h ^= data[2] << 16;
      case 2: h ^= data[1] << 8;
      case 1: h ^= data[0];
          h *= m;
      };
    }
    else
    {
      switch(len)
      {
      case 3: d |= data[2] << 16;
      case 2: d |= data[1] << 8;
      case 1: d |= data[0];
      case 0: h ^= (t >> sr) | (d << sl);
          h *= m;
      }
    }

    h ^= h >> 13;
    h *= m;
    h ^= h >> 15;

    return h;
  }
  else
  {
    while(len >= 4)
    {
      uint32_t k = *(uint32_t *)data;

      MIX(h,k,m);

      data += 4;
      len -= 4;
    }

    //----------
    // Handle tail bytes

    switch(len)
    {
    case 3: h ^= data[2] << 16;
    case 2: h ^= data[1] << 8;
    case 1: h ^= data[0];
        h *= m;
    };

    h ^= h >> 13;
    h *= m;
    h ^= h >> 15;

    return h;
  }
}